

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_instancenorm.cpp
# Opt level: O0

int main(void)

{
  uint in_EAX;
  int iVar1;
  uint64_t unaff_retaddr;
  
  prng_srand(unaff_retaddr,(prng_rand_t *)(ulong)in_EAX);
  iVar1 = test_instancenorm_0();
  return (int)(iVar1 != 0);
}

Assistant:

int main()
{
    SRAND(7767517);

    return 0
        || test_instancenorm_0()
        ;
}